

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::ByteCodeWriter::TryWriteArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,ArgSlot arg)

{
  bool bVar1;
  undefined1 local_19 [8];
  OpLayoutT_ArgNoSrc<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((DAT_015b5fbd == '\0') && (DAT_015b5fbc == '\0')) {
    local_19[0] = (undefined1)arg;
    bVar1 = arg < 0x100;
  }
  else {
    bVar1 = false;
  }
  if (bVar1 != false) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_19,1);
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteArgNoSrc(OpCode op, ArgSlot arg)
    {
        OpLayoutT_ArgNoSrc<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Arg, arg))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }